

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_zz_fp(DisasContext_conflict1 *s,arg_rr_esz *a,undefined1 *fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t oprsz;
  uint32_t dofs;
  uint32_t aofs;
  TCGv_ptr ptr;
  TCGv_ptr status;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  undefined1 *fn_local;
  arg_rr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  oprsz = vec_full_reg_size(s);
  ptr = get_fpstatus_ptr_aarch64(tcg_ctx_00,a->esz == 1);
  dofs = vec_full_reg_offset(s,a->rd);
  aofs = vec_full_reg_offset(s,a->rn);
  tcg_gen_gvec_2_ptr_aarch64(tcg_ctx_00,dofs,aofs,ptr,oprsz,oprsz,0,fn);
  tcg_temp_free_ptr(tcg_ctx_00,ptr);
  return;
}

Assistant:

static void do_zz_fp(DisasContext *s, arg_rr_esz *a, gen_helper_gvec_2_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);

    tcg_gen_gvec_2_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                       vec_full_reg_offset(s, a->rn),
                       status, vsz, vsz, 0, fn);
    tcg_temp_free_ptr(tcg_ctx, status);
}